

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

int generate_by_wrapper_n(uchar *script,size_t script_len,size_t *write_len)

{
  size_t sVar1;
  size_t used_len;
  size_t *write_len_local;
  size_t script_len_local;
  uchar *script_local;
  
  sVar1 = *write_len;
  if (((sVar1 == 0) || (script_len < sVar1 + 1)) || (10000 < sVar1 + 1)) {
    script_local._4_4_ = -2;
  }
  else {
    script[sVar1] = 0x92;
    *write_len = sVar1 + 1;
    script_local._4_4_ = 0;
  }
  return script_local._4_4_;
}

Assistant:

static int generate_by_wrapper_n(
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    size_t used_len = *write_len;
    if (!used_len || (used_len + 1 > script_len) || (used_len + 1 > DESCRIPTOR_WITNESS_SCRIPT_MAX_SIZE))
        return WALLY_EINVAL;

    script[used_len] = OP_0NOTEQUAL;
    *write_len = used_len + 1;
    return WALLY_OK;
}